

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::objectivec::FilePath_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FileDescriptor *file)

{
  string basename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string directory;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  basename._M_dataplus._M_p = (pointer)&basename.field_2;
  basename._M_string_length = 0;
  directory._M_dataplus._M_p = (pointer)&directory.field_2;
  directory._M_string_length = 0;
  basename.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  directory.field_2._M_local_buf[0] = '\0';
  anon_unknown_0::PathSplit(*(string **)this,&directory,&basename);
  if (directory._M_string_length != 0) {
    std::operator+(&local_58,&directory,"/");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  StripProto(&local_58,&basename);
  std::__cxx11::string::operator=((string *)&basename,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  anon_unknown_0::UnderscoresToCamelCase(&local_58,&basename,true);
  std::__cxx11::string::operator=((string *)&basename,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&directory);
  std::__cxx11::string::~string((string *)&basename);
  return __return_storage_ptr__;
}

Assistant:

string FilePath(const FileDescriptor* file) {
  string output;
  string basename;
  string directory;
  PathSplit(file->name(), &directory, &basename);
  if (directory.length() > 0) {
    output = directory + "/";
  }
  basename = StripProto(basename);

  // CamelCase to be more ObjC friendly.
  basename = UnderscoresToCamelCase(basename, true);

  output += basename;
  return output;
}